

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crop.cpp
# Opt level: O2

void __thiscall
ncnn::Crop::resolve_crop_roi
          (Crop *this,Mat *bottom_blob,int *_woffset,int *_hoffset,int *_coffset,int *_outw,
          int *_outh,int *_outc)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  void *pvVar6;
  void *pvVar7;
  void *pvVar8;
  int iVar9;
  int iVar10;
  ulong uVar11;
  ulong uVar12;
  uint uVar13;
  uint uVar14;
  int local_40 [4];
  int _axes [3];
  
  uVar1 = bottom_blob->dims;
  uVar2 = bottom_blob->w;
  uVar3 = bottom_blob->h;
  uVar4 = bottom_blob->c;
  pvVar6 = (this->starts).data;
  if ((((pvVar6 == (void *)0x0) || ((long)(this->starts).c * (this->starts).cstep == 0)) ||
      (pvVar7 = (this->ends).data, pvVar7 == (void *)0x0)) ||
     ((long)(this->ends).c * (this->ends).cstep == 0)) {
    *_woffset = this->woffset;
    *_hoffset = this->hoffset;
    *_coffset = this->coffset;
    *_outw = uVar2;
    *_outh = uVar3;
    *_outc = uVar4;
    if (uVar1 == 3) {
      if (this->coffset == -0xe9 && this->hoffset == -0xe9) {
        *_woffset = 0;
        *_hoffset = 0;
        *_outw = uVar2;
        *_outh = uVar3;
        iVar10 = uVar4 - (this->woffset + this->woffset2);
        *_outc = iVar10;
        iVar9 = this->outw;
      }
      else if (this->coffset == -0xe9) {
        *_woffset = 0;
        *_outw = uVar2;
        iVar10 = uVar3 - (this->woffset + this->woffset2);
        *_outh = iVar10;
        iVar9 = this->outw;
        if (iVar9 != -0xe9) {
          if (iVar10 < iVar9) {
            iVar9 = iVar10;
          }
          *_outh = iVar9;
        }
        iVar10 = uVar4 - (this->hoffset + this->hoffset2);
        *_outc = iVar10;
        iVar9 = this->outh;
      }
      else {
        iVar10 = uVar2 - (this->woffset + this->woffset2);
        *_outw = iVar10;
        iVar9 = this->outw;
        if (iVar9 != -0xe9) {
          if (iVar10 < iVar9) {
            iVar9 = iVar10;
          }
          *_outw = iVar9;
        }
        iVar10 = uVar3 - (this->hoffset + this->hoffset2);
        *_outh = iVar10;
        iVar9 = this->outh;
        if (iVar9 != -0xe9) {
          if (iVar10 < iVar9) {
            iVar9 = iVar10;
          }
          *_outh = iVar9;
        }
        iVar10 = uVar4 + this->coffset2 * -2;
        *_outc = iVar10;
        iVar9 = this->outc;
      }
      if (iVar9 != -0xe9) {
        if (iVar10 < iVar9) {
          iVar9 = iVar10;
        }
        *_outc = iVar9;
      }
    }
    else if (uVar1 == 2) {
      if (this->hoffset == -0xe9) {
        *_woffset = 0;
        *_hoffset = this->woffset;
        *_outw = uVar2;
        iVar10 = uVar3 - (this->woffset + this->woffset2);
        *_outh = iVar10;
        iVar9 = this->outw;
      }
      else {
        iVar10 = uVar2 - (this->woffset + this->woffset2);
        *_outw = iVar10;
        iVar9 = this->outw;
        if (iVar9 != -0xe9) {
          if (iVar10 < iVar9) {
            iVar9 = iVar10;
          }
          *_outw = iVar9;
        }
        iVar10 = uVar3 - (this->hoffset + this->hoffset2);
        *_outh = iVar10;
        iVar9 = this->outh;
      }
      if (iVar9 != -0xe9) {
        if (iVar10 < iVar9) {
          iVar9 = iVar10;
        }
        *_outh = iVar9;
      }
    }
    else if (uVar1 == 1) {
      iVar10 = uVar2 - (this->woffset + this->woffset2);
      *_outw = iVar10;
      iVar9 = this->outw;
      if (iVar9 != -0xe9) {
        if (iVar10 < iVar9) {
          iVar9 = iVar10;
        }
        *_outw = iVar9;
      }
    }
  }
  else {
    *_woffset = 0;
    *_hoffset = 0;
    *_coffset = 0;
    *_outw = uVar2;
    *_outh = uVar3;
    *_outc = uVar4;
    pvVar8 = (this->axes).data;
    local_40[0] = 0;
    local_40[1] = 1;
    local_40[2] = 2;
    uVar13 = (this->axes).w;
    if (uVar13 == 0) {
      uVar12 = 0;
      if (0 < (int)uVar1) {
        uVar12 = (ulong)uVar1;
      }
    }
    else {
      uVar11 = 0;
      uVar12 = (ulong)uVar13;
      if ((int)uVar13 < 1) {
        uVar12 = 0;
      }
      for (; uVar12 != uVar11; uVar11 = uVar11 + 1) {
        iVar9 = *(int *)((long)pvVar8 + uVar11 * 4);
        local_40[uVar11] = (iVar9 >> 0x1f & uVar1) + iVar9;
      }
    }
    for (uVar11 = 0; uVar12 != uVar11; uVar11 = uVar11 + 1) {
      iVar9 = local_40[uVar11];
      iVar10 = *(int *)((long)pvVar6 + uVar11 * 4);
      iVar5 = *(int *)((long)pvVar7 + uVar11 * 4);
      uVar13 = iVar10 >> 0x1f;
      if (uVar1 == 3) {
        if (iVar9 == 2) goto LAB_00128072;
        if (iVar9 == 1) {
LAB_0012809c:
          *_hoffset = (uVar13 & uVar3) + iVar10;
          uVar13 = 0;
          if (iVar5 < 1) {
            uVar13 = uVar3;
          }
          uVar14 = uVar13 + iVar5;
          if ((int)uVar3 <= (int)(uVar13 + iVar5)) {
            uVar14 = uVar3;
          }
          *_outh = uVar14 - *_woffset;
        }
        else if (iVar9 == 0) {
          iVar10 = (uVar13 & uVar4) + iVar10;
          *_coffset = iVar10;
          uVar13 = 0;
          if (iVar5 < 1) {
            uVar13 = uVar4;
          }
          uVar14 = uVar13 + iVar5;
          if ((int)uVar4 <= (int)(uVar13 + iVar5)) {
            uVar14 = uVar4;
          }
          *_outc = uVar14 - iVar10;
        }
      }
      else if (uVar1 == 2) {
        if (iVar9 == 1) goto LAB_00128072;
        if (iVar9 == 0) goto LAB_0012809c;
      }
      else if (uVar1 == 1) {
LAB_00128072:
        iVar10 = (uVar13 & uVar2) + iVar10;
        *_woffset = iVar10;
        uVar13 = 0;
        if (iVar5 < 1) {
          uVar13 = uVar2;
        }
        uVar14 = uVar13 + iVar5;
        if ((int)uVar2 <= (int)(uVar13 + iVar5)) {
          uVar14 = uVar2;
        }
        *_outw = uVar14 - iVar10;
      }
    }
  }
  return;
}

Assistant:

void Crop::resolve_crop_roi(const Mat& bottom_blob, int& _woffset, int& _hoffset, int& _coffset, int& _outw, int& _outh, int& _outc) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    int dims = bottom_blob.dims;

    bool numpy_style_slice = !starts.empty() && !ends.empty();
    if (numpy_style_slice)
    {
        _woffset = 0;
        _hoffset = 0;
        _coffset = 0;
        _outw = w;
        _outh = h;
        _outc = channels;

        const int* starts_ptr = starts;
        const int* ends_ptr = ends;
        const int* axes_ptr = axes;

        int _axes[3] = {0,1,2};
        int num_axis = axes.w;
        if (num_axis == 0)
        {
            num_axis = dims;
        }
        else
        {
            for (int i=0; i<num_axis; i++)
            {
                int axis = axes_ptr[i];
                if (axis < 0)
                    axis = dims + axis;
                _axes[i] = axis;
            }
        }

        for (int i=0; i<num_axis; i++)
        {
            int axis = _axes[i];
            int start = starts_ptr[i];
            int end = ends_ptr[i];

            if (dims == 1) // axis == 0
            {
                _woffset = start >= 0 ? start : w + start;
                _outw = std::min(w, end > 0 ? end : w + end) - _woffset;
            }
            if (dims == 2)
            {
                if (axis == 0)
                {
                    _hoffset = start >= 0 ? start : h + start;
                    _outh = std::min(h, end > 0 ? end : h + end) - _woffset;
                }
                if (axis == 1)
                {
                    _woffset = start >= 0 ? start : w + start;
                    _outw = std::min(w, end > 0 ? end : w + end) - _woffset;
                }
            }
            if (dims == 3)
            {
                if (axis == 0)
                {
                    _coffset = start >= 0 ? start : channels + start;
                    _outc = std::min(channels, end > 0 ? end : channels + end) - _coffset;
                }
                if (axis == 1)
                {
                    _hoffset = start >= 0 ? start : h + start;
                    _outh = std::min(h, end > 0 ? end : h + end) - _woffset;
                }
                if (axis == 2)
                {
                    _woffset = start >= 0 ? start : w + start;
                    _outw = std::min(w, end > 0 ? end : w + end) - _woffset;
                }
            }
        }
    }
    else
    {
        _woffset = woffset;
        _hoffset = hoffset;
        _coffset = coffset;
        _outw = w;
        _outh = h;
        _outc = channels;

        if (dims == 1)
        {
            _outw = w - woffset - woffset2;
            if (outw != -233)
                _outw = std::min(outw, _outw);
        }
        if (dims == 2)
        {
            if (hoffset == -233)
            {
                _woffset = 0;
                _hoffset = woffset;

                _outw = w;
                _outh = h - woffset - woffset2;
                if (outw != -233)
                    _outh = std::min(outw, _outh);
            }
            else
            {
                _outw = w - woffset - woffset2;
                if (outw != -233)
                    _outw = std::min(outw, _outw);

                _outh = h - hoffset - hoffset2;
                if (outh != -233)
                    _outh = std::min(outh, _outh);
            }
        }
        if (dims == 3)
        {
            if (hoffset == -233 && coffset == -233)
            {
                _woffset = 0;
                _hoffset = 0;

                _outw = w;
                _outh = h;
                _outc = channels - woffset - woffset2;
                if (outw != -233)
                    _outc = std::min(outw, _outc);
            }
            else if (coffset == -233)
            {
                _woffset = 0;

                _outw = w;
                _outh = h - woffset - woffset2;
                if (outw != -233)
                    _outh = std::min(outw, _outh);

                _outc = channels - hoffset - hoffset2;
                if (outh != -233)
                    _outc = std::min(outh, _outc);
            }
            else
            {
                _outw = w - woffset - woffset2;
                if (outw != -233)
                    _outw = std::min(outw, _outw);

                _outh = h - hoffset - hoffset2;
                if (outh != -233)
                    _outh = std::min(outh, _outh);

                _outc = channels - coffset2 - coffset2;
                if (outc != -233)
                    _outc = std::min(outc, _outc);
            }
        }
    }
}